

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

uint16_t wirehair::GetDenseCount(uint N)

{
  uint uVar1;
  uint uVar2;
  uint in_EDI;
  uint16_t dense_count;
  DensePoint midPoint;
  uint mid;
  uint high;
  uint low;
  DensePoint highPoint;
  DensePoint lowPoint;
  uint16_t local_22;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  if (in_EDI < 0x800) {
    if (in_EDI < 0x41) {
      return (ushort)(byte)kTinyDenseCounts[in_EDI];
    }
    if (in_EDI < 0x1f5) {
      local_c = 0x1a0040;
      local_10 = 0x2301f4;
    }
    else if (in_EDI < 0x3e9) {
      local_c = 0x2301f4;
      local_10 = 0x3003e8;
    }
    else {
      local_c = 0x3003e8;
      local_10 = 0x3e0800;
    }
  }
  else {
    local_14 = 0;
    local_18 = 0x3f;
    uVar1 = local_18;
    while (local_18 = uVar1, uVar2 = local_18 + local_14 >> 1, uVar2 != local_14) {
      uVar1 = uVar2;
      if ((*(uint *)(kDensePoints + (ulong)uVar2 * 4) & 0xffff) < in_EDI) {
        uVar1 = local_18;
        local_14 = uVar2;
      }
    }
    local_c = *(uint *)(kDensePoints + (ulong)local_14 * 4);
    local_10 = *(uint *)(kDensePoints + (ulong)(local_14 + 1) * 4);
  }
  local_22 = LinearInterpolate(local_c & 0xffff,local_10 & 0xffff,local_c >> 0x10,local_10 >> 0x10,
                               in_EDI);
  switch(local_22 & 3) {
  case 0:
    local_22 = local_22 + 2;
    break;
  case 1:
    local_22 = local_22 + 1;
    break;
  case 2:
    break;
  case 3:
    local_22 = local_22 + 3;
  }
  return local_22;
}

Assistant:

uint16_t GetDenseCount(unsigned N)
{
    DensePoint lowPoint, highPoint;

    if (N < (kTinyTableCount + kSmallTableCount)) {
        if (N < kTinyTableCount) {
            return kTinyDenseCounts[N];
        }
        else if (N <= 500) {
            lowPoint.N = 64;
            highPoint.N = 500;
            lowPoint.DenseCount = 26;
            highPoint.DenseCount = 35;
        }
        else if (N <= 1000) {
            lowPoint.N = 500;
            highPoint.N = 1000;
            lowPoint.DenseCount = 35;
            highPoint.DenseCount = 48;
        }
        else // if (N < 2048)
        {
            lowPoint.N = 1000;
            highPoint.N = 2048;
            lowPoint.DenseCount = 48;
            highPoint.DenseCount = 62;
        }
    }
    else
    {
        CAT_DEBUG_ASSERT(N >= (kTinyTableCount + kSmallTableCount) && N <= 64000);

        unsigned low = 0;
        unsigned high = kDensePointCount - 1;

        for (;;)
        {
            const unsigned mid = (high + low) / 2;
            if (mid == low) {
                break;
            }

            const DensePoint midPoint = kDensePoints[mid];

            if (N > midPoint.N) {
                low = mid;
            }
            else {
                high = mid;
            }
        }

        CAT_DEBUG_ASSERT(low < kDensePointCount);
        lowPoint = kDensePoints[low];
        CAT_DEBUG_ASSERT(low + 1 < kDensePointCount);
        highPoint = kDensePoints[low + 1];
    }

    CAT_DEBUG_ASSERT(lowPoint.N <= N);
    CAT_DEBUG_ASSERT(highPoint.N >= N);

    uint16_t dense_count = LinearInterpolate(
        lowPoint.N,
        highPoint.N,
        lowPoint.DenseCount,
        highPoint.DenseCount,
        N);

    CAT_DEBUG_ASSERT(dense_count > 0 && dense_count <= kMaxDenseCount);

    // Round up to the next D s.t. D Mod 4 = 2
    switch (dense_count % 4)
    {
    case 0: dense_count += 2; break;
    case 1: dense_count += 1; break;
    case 2: break;
    case 3: dense_count += 3; break;
    }

    return dense_count;
}